

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

bool children(log_multi *b,uint32_t *current,uint32_t *class_index,uint32_t label)

{
  v_array<node> *this;
  uint32_t *puVar1;
  uint node;
  uint uVar2;
  uint32_t node_00;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ostream *poVar6;
  node *pnVar7;
  uint uVar8;
  node local_88;
  
  this = &b->nodes;
  local_88.preds._end._4_4_ = 0;
  local_88.parent = 0;
  local_88._4_4_ = 0;
  local_88.preds._begin = (node_pred *)0x0;
  local_88.preds._end._0_4_ = label;
  sVar3 = v_array<node_pred>::unique_add_sorted
                    (&(b->nodes)._begin[*current].preds,(node_pred *)&local_88);
  *class_index = (uint32_t)sVar3;
  puVar1 = &(b->nodes)._begin[*current].preds._begin[sVar3 & 0xffffffff].label_count;
  *puVar1 = *puVar1 + 1;
  uVar4 = (ulong)*current;
  pnVar7 = (b->nodes)._begin;
  uVar8 = pnVar7[uVar4].preds._begin[*class_index].label_count;
  if (pnVar7[uVar4].max_count < uVar8) {
    pnVar7[uVar4].max_count = uVar8;
    this->_begin[*current].max_count_label = this->_begin[*current].preds._begin[*class_index].label
    ;
    uVar4 = (ulong)*current;
    pnVar7 = this->_begin;
  }
  if (pnVar7[uVar4].internal != false) {
    return true;
  }
  if (1 < (ulong)(((long)pnVar7[uVar4].preds._end - (long)pnVar7[uVar4].preds._begin) / 0x18)) {
    if (b->predictors_used < b->max_predictors) {
      uVar4 = ((long)(b->nodes)._end - (long)pnVar7) / 0x58;
      init_node();
      v_array<node>::push_back(this,&local_88);
      uVar5 = ((long)(b->nodes)._end - (long)(b->nodes)._begin) / 0x58;
      init_node();
      v_array<node>::push_back(this,&local_88);
      pnVar7 = (b->nodes)._begin;
      sVar3 = b->predictors_used;
      b->predictors_used = sVar3 + 1;
      pnVar7[*current].base_predictor = (uint32_t)sVar3;
      node_00 = (uint32_t)uVar4;
      uVar4 = uVar4 & 0xffffffff;
      uVar8 = (uint)uVar5;
      uVar5 = uVar5 & 0xffffffff;
    }
    else {
      if (pnVar7[uVar4].min_count - pnVar7[uVar4].max_count <=
          (pnVar7->min_count + 1) * b->swap_resist) goto LAB_001f4e67;
      node_00 = find_switch_node(b);
      uVar4 = (ulong)node_00;
      pnVar7 = (b->nodes)._begin;
      uVar8 = pnVar7[uVar4].parent;
      uVar5 = (ulong)uVar8;
      uVar2 = pnVar7[uVar5].parent;
      if (pnVar7[uVar4].min_count != pnVar7->min_count) {
        poVar6 = std::operator<<((ostream *)&std::cout,"glargh ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," != ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::endl<char,std::char_traits<char>>(poVar6);
        pnVar7 = this->_begin;
      }
      b->nbofswaps = b->nbofswaps + 1;
      node = (&pnVar7[uVar5].left)[node_00 != pnVar7[uVar5].right];
      if (uVar8 == pnVar7[uVar2].left) {
        pnVar7[uVar2].left = node;
      }
      else {
        pnVar7[uVar2].right = node;
      }
      (b->nodes)._begin[node].parent = uVar2;
      update_min_count(b,node);
      init_leaf((b->nodes)._begin + uVar4);
      pnVar7 = (b->nodes)._begin;
      pnVar7[*current].base_predictor = pnVar7[uVar5].base_predictor;
      init_leaf((b->nodes)._begin + uVar5);
    }
    (b->nodes)._begin[*current].left = node_00;
    uVar2 = *current;
    (b->nodes)._begin[uVar4].parent = uVar2;
    (b->nodes)._begin[uVar2].right = uVar8;
    uVar8 = *current;
    (b->nodes)._begin[uVar5].parent = uVar8;
    pnVar7 = (b->nodes)._begin;
    pnVar7[uVar4].min_count = pnVar7[uVar8].min_count >> 1;
    pnVar7 = (b->nodes)._begin;
    pnVar7[uVar5].min_count = pnVar7[*current].min_count - pnVar7[uVar4].min_count;
    update_min_count(b,node_00);
    pnVar7 = (b->nodes)._begin;
    pnVar7[uVar4].max_count_label = pnVar7[*current].max_count_label;
    pnVar7 = (b->nodes)._begin;
    pnVar7[uVar5].max_count_label = pnVar7[*current].max_count_label;
    (b->nodes)._begin[*current].internal = true;
    uVar4 = (ulong)*current;
    pnVar7 = (b->nodes)._begin;
  }
LAB_001f4e67:
  return pnVar7[uVar4].internal;
}

Assistant:

bool children(log_multi& b, uint32_t& current, uint32_t& class_index, uint32_t label)
{
  class_index = (uint32_t)b.nodes[current].preds.unique_add_sorted(node_pred(label));
  b.nodes[current].preds[class_index].label_count++;

  if (b.nodes[current].preds[class_index].label_count > b.nodes[current].max_count)
  {
    b.nodes[current].max_count = b.nodes[current].preds[class_index].label_count;
    b.nodes[current].max_count_label = b.nodes[current].preds[class_index].label;
  }

  if (b.nodes[current].internal)
    return true;
  else if (b.nodes[current].preds.size() > 1 &&
      (b.predictors_used < b.max_predictors ||
          b.nodes[current].min_count - b.nodes[current].max_count > b.swap_resist * (b.nodes[0].min_count + 1)))
  {
    // need children and we can make them.
    uint32_t left_child;
    uint32_t right_child;
    if (b.predictors_used < b.max_predictors)
    {
      left_child = (uint32_t)b.nodes.size();
      b.nodes.push_back(init_node());
      right_child = (uint32_t)b.nodes.size();
      b.nodes.push_back(init_node());
      b.nodes[current].base_predictor = (uint32_t)b.predictors_used++;
    }
    else
    {
      uint32_t swap_child = find_switch_node(b);
      uint32_t swap_parent = b.nodes[swap_child].parent;
      uint32_t swap_grandparent = b.nodes[swap_parent].parent;
      if (b.nodes[swap_child].min_count != b.nodes[0].min_count)
        cout << "glargh " << b.nodes[swap_child].min_count << " != " << b.nodes[0].min_count << endl;
      b.nbofswaps++;

      uint32_t nonswap_child;
      if (swap_child == b.nodes[swap_parent].right)
        nonswap_child = b.nodes[swap_parent].left;
      else
        nonswap_child = b.nodes[swap_parent].right;

      if (swap_parent == b.nodes[swap_grandparent].left)
        b.nodes[swap_grandparent].left = nonswap_child;
      else
        b.nodes[swap_grandparent].right = nonswap_child;
      b.nodes[nonswap_child].parent = swap_grandparent;
      update_min_count(b, nonswap_child);

      init_leaf(b.nodes[swap_child]);
      left_child = swap_child;
      b.nodes[current].base_predictor = b.nodes[swap_parent].base_predictor;
      init_leaf(b.nodes[swap_parent]);
      right_child = swap_parent;
    }
    b.nodes[current].left = left_child;
    b.nodes[left_child].parent = current;
    b.nodes[current].right = right_child;
    b.nodes[right_child].parent = current;

    b.nodes[left_child].min_count = b.nodes[current].min_count / 2;
    b.nodes[right_child].min_count = b.nodes[current].min_count - b.nodes[left_child].min_count;
    update_min_count(b, left_child);

    b.nodes[left_child].max_count_label = b.nodes[current].max_count_label;
    b.nodes[right_child].max_count_label = b.nodes[current].max_count_label;

    b.nodes[current].internal = true;
  }
  return b.nodes[current].internal;
}